

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_stream_socket.hpp
# Opt level: O0

void __thiscall
asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>::initiate_async_receive::operator()
          (initiate_async_receive *this,
          function<void_(const_std::error_code_&,_unsigned_long)> *handler,
          mutable_buffers_1 *buffers,message_flags flags)

{
  non_const_lvalue<std::function<void_(const_std::error_code_&,_unsigned_long)>_&> *in_RDI;
  any_io_executor *in_stack_00000028;
  function<void_(const_std::error_code_&,_unsigned_long)> *in_stack_00000030;
  message_flags in_stack_0000003c;
  mutable_buffers_1 *in_stack_00000040;
  non_const_lvalue<std::function<void_(const_std::error_code_&,_unsigned_long)>_&> handler2;
  function<void_(const_std::error_code_&,_unsigned_long)> *in_stack_ffffffffffffff78;
  
  asio::detail::non_const_lvalue<std::function<void_(const_std::error_code_&,_unsigned_long)>_&>::
  non_const_lvalue(in_RDI,in_stack_ffffffffffffff78);
  asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
  get_service(*(io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
                **)&(in_RDI->value).super__Function_base._M_functor);
  asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
  get_implementation(*(io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
                       **)&(in_RDI->value).super__Function_base._M_functor);
  asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
  get_executor(*(io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
                 **)&(in_RDI->value).super__Function_base._M_functor);
  asio::detail::reactive_socket_service_base::
  async_receive<asio::mutable_buffers_1,std::function<void(std::error_code_const&,unsigned_long)>,asio::any_io_executor>
            ((reactive_socket_service_base *)handler2.value.super__Function_base._M_functor._8_8_,
             (base_implementation_type *)
             handler2.value.super__Function_base._M_functor._M_unused._0_8_,in_stack_00000040,
             in_stack_0000003c,in_stack_00000030,in_stack_00000028);
  asio::detail::non_const_lvalue<std::function<void_(const_std::error_code_&,_unsigned_long)>_&>::
  ~non_const_lvalue((non_const_lvalue<std::function<void_(const_std::error_code_&,_unsigned_long)>_&>
                     *)0x71f6c7);
  return;
}

Assistant:

void operator()(ReadHandler&& handler,
        const MutableBufferSequence& buffers,
        socket_base::message_flags flags) const
    {
      // If you get an error on the following line it means that your handler
      // does not meet the documented type requirements for a ReadHandler.
      ASIO_READ_HANDLER_CHECK(ReadHandler, handler) type_check;

      detail::non_const_lvalue<ReadHandler> handler2(handler);
      self_->impl_.get_service().async_receive(
          self_->impl_.get_implementation(), buffers, flags,
          handler2.value, self_->impl_.get_executor());
    }